

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall ON_FontMetrics::IsUnset(ON_FontMetrics *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = false;
  bVar2 = false;
  if ((((((this->m_UPM == 0) && (bVar2 = bVar1, this->m_ascent == 0)) && (this->m_descent == 0)) &&
       ((this->m_line_space == 0 && (this->m_ascent_of_capital == 0)))) &&
      ((this->m_ascent_of_x == 0 &&
       ((this->m_strikeout_thickness == 0 && (this->m_strikeout_position == 0)))))) &&
     (this->m_underscore_thickness == 0)) {
    bVar2 = this->m_underscore_position == 0;
  }
  return bVar2;
}

Assistant:

bool ON_FontMetrics::IsUnset() const
{
  return (
    0 == m_UPM
    && 0 == m_ascent
    && 0 == m_descent
    && 0 == m_line_space
    && 0 == m_ascent_of_capital
    && 0 == m_ascent_of_x
    && 0 == m_strikeout_thickness
    && 0 == m_strikeout_position
    && 0 == m_underscore_thickness
    && 0 == m_underscore_position
    );
}